

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

JSON * phosg::JSON::parse(JSON *__return_storage_ptr__,StringReader *r,bool disable_extensions)

{
  int8_t iVar1;
  char cVar2;
  int8_t iVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  int8_t iVar7;
  char cVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  uint8_t uVar12;
  uint uVar13;
  int iVar14;
  string *this;
  size_t sVar15;
  parse_error *ppVar16;
  size_t sVar17;
  JSON *item;
  ulong x;
  ulong uVar18;
  double local_f0;
  JSON key;
  double local_a8;
  string local_90;
  string data;
  
  skip_whitespace_and_comments(r,disable_extensions);
  JSON(__return_storage_ptr__);
  iVar1 = StringReader::get_s8(r,false);
  if (iVar1 == '[') {
    list();
    ::std::__detail::__variant::
    _Move_assign_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
    ::operator=((_Move_assign_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                 *)__return_storage_ptr__,
                (_Move_assign_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                 *)&key);
    ::std::__detail::__variant::
    _Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                         *)&key);
    cVar2 = StringReader::get_s8(r,true);
    cVar8 = '[';
    while( true ) {
      if (cVar2 == ']') {
        return __return_storage_ptr__;
      }
      if (cVar8 != cVar2) break;
      skip_whitespace_and_comments(r,disable_extensions);
      if ((!disable_extensions) && (iVar1 = StringReader::get_s8(r,false), iVar1 == ']')) {
        StringReader::get_s8(r,true);
        return __return_storage_ptr__;
      }
      parse(&key,r,disable_extensions);
      emplace_back(__return_storage_ptr__,&key);
      ::std::__detail::__variant::
      _Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
      ::~_Variant_storage((_Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                           *)&key);
      skip_whitespace_and_comments(r,disable_extensions);
      cVar2 = StringReader::get_s8(r,true);
      cVar8 = ',';
    }
    ppVar16 = (parse_error *)__cxa_allocate_exception(0x10);
    sVar17 = StringReader::where(r);
    ::std::__cxx11::to_string(&data,sVar17);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,
                     "string is not a list; pos=",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
    parse_error::parse_error(ppVar16,(string *)&key);
    __cxa_throw(ppVar16,&parse_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (iVar1 == '{') {
    dict();
    ::std::__detail::__variant::
    _Move_assign_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
    ::operator=((_Move_assign_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                 *)__return_storage_ptr__,
                (_Move_assign_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                 *)&key);
    ::std::__detail::__variant::
    _Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                         *)&key);
    iVar1 = StringReader::get_s8(r,true);
    uVar13 = 0x7b;
    while( true ) {
      if (iVar1 == '}') {
        return __return_storage_ptr__;
      }
      item = (JSON *)(ulong)(uint)(int)iVar1;
      if (uVar13 != (int)iVar1) break;
      skip_whitespace_and_comments(r,disable_extensions);
      if ((!disable_extensions) && (iVar1 = StringReader::get_s8(r,false), iVar1 == '}')) {
        StringReader::get_s8(r,true);
        return __return_storage_ptr__;
      }
      parse(&key,r,disable_extensions);
      skip_whitespace_and_comments(r,disable_extensions);
      iVar1 = StringReader::get_s8(r,true);
      if (iVar1 != ':') {
        ppVar16 = (parse_error *)__cxa_allocate_exception(0x10);
        sVar17 = StringReader::where(r);
        ::std::__cxx11::to_string(&local_90,sVar17);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data,
                         "dictionary does not contain key/value pairs; pos=",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_90);
        parse_error::parse_error(ppVar16,&data);
        __cxa_throw(ppVar16,&parse_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      skip_whitespace_and_comments(r,disable_extensions);
      this = as_string_abi_cxx11_(&key);
      parse((JSON *)&data,r,disable_extensions);
      emplace((pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_false,_true>,_bool>
               *)__return_storage_ptr__,(JSON *)this,&data,item);
      ::std::__detail::__variant::
      _Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
      ::~_Variant_storage((_Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                           *)&data);
      skip_whitespace_and_comments(r,disable_extensions);
      iVar1 = StringReader::get_s8(r,true);
      ::std::__detail::__variant::
      _Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
      ::~_Variant_storage((_Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                           *)&key);
      uVar13 = 0x2c;
    }
    ppVar16 = (parse_error *)__cxa_allocate_exception(0x10);
    sVar17 = StringReader::where(r);
    ::std::__cxx11::to_string(&data,sVar17);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,
                     "string is not a dictionary; pos=",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
    parse_error::parse_error(ppVar16,(string *)&key);
    __cxa_throw(ppVar16,&parse_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (((iVar1 != '+') && (iVar1 != '-')) && (9 < (int)iVar1 - 0x30U)) {
    if (iVar1 == '\"') {
      StringReader::get_s8(r,true);
      data._M_dataplus._M_p = (pointer)&data.field_2;
      data._M_string_length = 0;
      data.field_2._M_local_buf[0] = '\0';
LAB_0010d46e:
      iVar1 = StringReader::get_s8(r,false);
      if (iVar1 == '\"') {
        StringReader::get_s8(r,true);
        JSON(&key,&data);
        ::std::__detail::__variant::
        _Move_assign_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
        ::operator=((_Move_assign_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                     *)__return_storage_ptr__,
                    (_Move_assign_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                     *)&key);
        ::std::__detail::__variant::
        _Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
        ::~_Variant_storage((_Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                             *)&key);
        ::std::__cxx11::string::~string((string *)&data);
        return __return_storage_ptr__;
      }
      cVar8 = StringReader::get_s8(r,true);
      if (cVar8 != '\\') goto LAB_0010d5c5;
      cVar8 = StringReader::get_s8(r,true);
      switch(cVar8) {
      case 'n':
        cVar8 = '\n';
        break;
      case 'o':
      case 'p':
      case 'q':
      case 's':
      case 'v':
      case 'w':
switchD_0010d4e9_caseD_6f:
        ppVar16 = (parse_error *)__cxa_allocate_exception(0x10);
        sVar17 = StringReader::where(r);
        ::std::__cxx11::to_string(&local_90,sVar17);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,
                         "invalid escape sequence in string; pos=",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_90);
        parse_error::parse_error(ppVar16,(string *)&key);
        __cxa_throw(ppVar16,&parse_error::typeinfo,::std::runtime_error::~runtime_error);
      case 'r':
        cVar8 = '\r';
        break;
      case 't':
        cVar8 = '\t';
        break;
      case 'u':
        iVar1 = StringReader::get_s8(r,true);
        bVar5 = value_for_hex_char(iVar1);
        iVar1 = StringReader::get_s8(r,true);
        bVar9 = value_for_hex_char(iVar1);
        iVar1 = StringReader::get_s8(r,true);
        bVar10 = value_for_hex_char(iVar1);
        iVar1 = StringReader::get_s8(r,true);
        bVar11 = value_for_hex_char(iVar1);
        if (0xff < (ushort)((ushort)bVar10 << 4 | (ushort)bVar9 << 8 | (ushort)bVar5 << 0xc)) {
          ppVar16 = (parse_error *)__cxa_allocate_exception(0x10);
          sVar17 = StringReader::where(r);
          ::std::__cxx11::to_string(&local_90,sVar17);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key
                           ,"non-ascii unicode character sequence in string; pos=",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_90);
          parse_error::parse_error(ppVar16,(string *)&key);
          __cxa_throw(ppVar16,&parse_error::typeinfo,::std::runtime_error::~runtime_error);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data,
                   bVar11 | (byte)((ushort)bVar10 << 4));
        goto LAB_0010d46e;
      case 'x':
        goto switchD_0010d4e9_caseD_78;
      default:
        if (((cVar8 != '\"') && (cVar8 != '/')) && (cVar8 != '\\')) {
          if (cVar8 == 'b') {
            cVar8 = '\b';
          }
          else {
            if (cVar8 != 'f') goto switchD_0010d4e9_caseD_6f;
            cVar8 = '\f';
          }
        }
      }
LAB_0010d5c5:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data,cVar8);
      goto LAB_0010d46e;
    }
    bVar4 = StringReader::skip_if(r,"null",4);
    if ((bVar4) || ((!disable_extensions && (bVar4 = StringReader::skip_if(r,"n",1), bVar4)))) {
      JSON(&key,(nullptr_t)0x0);
    }
    else {
      bVar4 = StringReader::skip_if(r,"true",4);
      if ((bVar4) || ((!disable_extensions && (bVar4 = StringReader::skip_if(r,"t",1), bVar4)))) {
        JSON(&key,true);
      }
      else {
        bVar4 = StringReader::skip_if(r,"false",5);
        if ((!bVar4) && ((disable_extensions || (bVar4 = StringReader::skip_if(r,"f",1), !bVar4))))
        {
          ppVar16 = (parse_error *)__cxa_allocate_exception(0x10);
          sVar17 = StringReader::where(r);
          ::std::__cxx11::to_string(&data,sVar17);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key
                           ,"unknown root sentinel; pos=",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &data);
          parse_error::parse_error(ppVar16,(string *)&key);
          __cxa_throw(ppVar16,&parse_error::typeinfo,::std::runtime_error::~runtime_error);
        }
        JSON(&key,false);
      }
    }
    goto LAB_0010d646;
  }
  if (iVar1 == '-') {
    StringReader::get_s8(r,true);
  }
  if (disable_extensions) {
LAB_0010d251:
    uVar18 = 0;
    while ((bVar4 = StringReader::eof(r), !bVar4 &&
           (iVar3 = StringReader::get_s8(r,false), (int)iVar3 - 0x30U < 10))) {
      iVar3 = StringReader::get_s8(r,true);
      uVar18 = (uVar18 * 10 + (long)iVar3) - 0x30;
    }
    bVar6 = StringReader::eof(r);
    local_a8 = (double)(long)uVar18;
    bVar4 = true;
    if ((!bVar6) && (iVar3 = StringReader::get_s8(r,false), iVar3 == '.')) {
      StringReader::get_s8(r,true);
      local_f0 = 0.1;
      while ((bVar4 = StringReader::eof(r), !bVar4 &&
             (iVar3 = StringReader::get_s8(r,false), (int)iVar3 - 0x30U < 10))) {
        iVar3 = StringReader::get_s8(r,true);
        local_a8 = local_a8 + (double)(iVar3 + -0x30) * local_f0;
        local_f0 = local_f0 * 0.1;
      }
      bVar4 = false;
    }
    bVar6 = StringReader::eof(r);
    if ((!bVar6) && (bVar5 = StringReader::get_s8(r,false), (bVar5 & 0xdf) == 0x45)) {
      StringReader::get_s8(r,true);
      iVar3 = StringReader::get_s8(r,false);
      if ((iVar3 == '-') || (iVar3 == '+')) {
        StringReader::get_s8(r,true);
      }
      iVar14 = 0;
      while ((bVar6 = StringReader::eof(r), !bVar6 &&
             (iVar7 = StringReader::get_s8(r,false), (int)iVar7 - 0x30U < 10))) {
        iVar7 = StringReader::get_s8(r,true);
        iVar14 = iVar14 * 10 + (int)iVar7 + -0x30;
      }
      if (iVar3 == '-') {
        for (; 0 < iVar14; iVar14 = iVar14 + -1) {
          uVar18 = (ulong)((double)(long)uVar18 * 0.1);
          local_a8 = local_a8 * 0.1;
        }
      }
      else {
        for (; 0 < iVar14; iVar14 = iVar14 + -1) {
          uVar18 = uVar18 * 10;
          local_a8 = local_a8 * 10.0;
        }
      }
    }
    if (!bVar4) {
      if (iVar1 == '-') {
        local_a8 = -local_a8;
      }
      JSON(&key,local_a8);
      goto LAB_0010d646;
    }
  }
  else {
    sVar17 = StringReader::where(r);
    sVar15 = StringReader::size(r);
    if ((sVar15 <= sVar17 + 2) || (iVar3 = StringReader::get_s8(r,false), iVar3 != '0'))
    goto LAB_0010d251;
    sVar17 = StringReader::where(r);
    iVar3 = StringReader::pget_s8(r,sVar17 + 1);
    if (iVar3 != 'x') goto LAB_0010d251;
    StringReader::where(r);
    StringReader::go(r);
    uVar18 = 0;
    while (bVar4 = StringReader::eof(r), !bVar4) {
      iVar3 = StringReader::get_s8(r,false);
      iVar14 = isxdigit((int)iVar3);
      if (iVar14 == 0) break;
      iVar3 = StringReader::get_s8(r,true);
      bVar5 = value_for_hex_char(iVar3);
      uVar18 = uVar18 << 4 | (ulong)bVar5;
    }
  }
  x = -uVar18;
  if (iVar1 != '-') {
    x = uVar18;
  }
  JSON(&key,x);
LAB_0010d646:
  ::std::__detail::__variant::
  _Move_assign_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
  ::operator=((_Move_assign_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
               *)__return_storage_ptr__,
              (_Move_assign_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
               *)&key);
  ::std::__detail::__variant::
  _Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                       *)&key);
  return __return_storage_ptr__;
switchD_0010d4e9_caseD_78:
  iVar1 = StringReader::get_s8(r,true);
  uVar12 = value_for_hex_char(iVar1);
  iVar1 = StringReader::get_s8(r,true);
  bVar5 = value_for_hex_char(iVar1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data,
             bVar5 | uVar12 << 4);
  goto LAB_0010d46e;
}

Assistant:

JSON JSON::parse(StringReader& r, bool disable_extensions) {
  skip_whitespace_and_comments(r, disable_extensions);

  JSON ret;
  char root_type_ch = r.get_s8(false);
  if (root_type_ch == '{') {
    ret = JSON::dict();
    char expected_separator = '{';
    char separator = r.get_s8();
    while (separator != '}') {
      if (separator != expected_separator) {
        throw parse_error("string is not a dictionary; pos=" + to_string(r.where()));
      }
      expected_separator = ',';

      skip_whitespace_and_comments(r, disable_extensions);
      if (!disable_extensions && (r.get_s8(false) == '}')) {
        r.get_s8();
        break;
      }

      JSON key = JSON::parse(r, disable_extensions);
      skip_whitespace_and_comments(r, disable_extensions);

      if (r.get_s8() != ':') {
        throw parse_error("dictionary does not contain key/value pairs; pos=" + to_string(r.where()));
      }
      skip_whitespace_and_comments(r, disable_extensions);

      ret.emplace(std::move(key.as_string()), JSON::parse(r, disable_extensions));
      skip_whitespace_and_comments(r, disable_extensions);
      separator = r.get_s8();
    }

  } else if (root_type_ch == '[') {
    ret = JSON::list();
    char expected_separator = '[';
    char separator = r.get_s8();
    while (separator != ']') {
      if (separator != expected_separator) {
        throw parse_error("string is not a list; pos=" + to_string(r.where()));
      }
      expected_separator = ',';

      skip_whitespace_and_comments(r, disable_extensions);
      if (!disable_extensions && (r.get_s8(false) == ']')) {
        r.get_s8();
        break;
      }

      ret.emplace_back(JSON::parse(r, disable_extensions));
      skip_whitespace_and_comments(r, disable_extensions);
      separator = r.get_s8();
    }

  } else if (root_type_ch == '-' || root_type_ch == '+' || isdigit(root_type_ch)) {
    int64_t int_data;
    double float_data;
    bool is_int = true;

    bool negative = false;
    if (root_type_ch == '-') {
      negative = true;
      r.get_s8();
    }

    if (!disable_extensions &&
        ((r.where() + 2) < r.size()) &&
        (r.get_s8(false) == '0') &&
        (r.pget_s8(r.where() + 1) == 'x')) { // hex
      r.go(r.where() + 2);

      int_data = 0;
      while (!r.eof() && isxdigit(r.get_s8(false))) {
        int_data = (int_data << 4) | value_for_hex_char(r.get_s8());
      }

    } else { // decimal
      int_data = 0;
      while (!r.eof() && isdigit(r.get_s8(false))) {
        int_data = int_data * 10 + (r.get_s8() - '0');
      }

      double this_place = 0.1;
      float_data = int_data;
      if (!r.eof() && r.get_s8(false) == '.') {
        is_int = false;
        r.get_s8();
        while (!r.eof() && isdigit(r.get_s8(false))) {
          float_data += (r.get_s8() - '0') * this_place;
          this_place *= 0.1;
        }
      }

      char exp_specifier = r.eof() ? '\0' : r.get_s8(false);
      if (exp_specifier == 'e' || exp_specifier == 'E') {
        r.get_s8();
        char sign_char = r.get_s8(false);
        bool e_negative = sign_char == '-';
        if (sign_char == '-' || sign_char == '+') {
          r.get_s8();
        }

        int e = 0;
        while (!r.eof() && isdigit(r.get_s8(false))) {
          e = e * 10 + (r.get_s8() - '0');
        }

        if (e_negative) {
          for (; e > 0; e--) {
            int_data *= 0.1;
            float_data *= 0.1;
          }
        } else {
          for (; e > 0; e--) {
            int_data *= 10;
            float_data *= 10;
          }
        }
      }
    }

    if (negative) {
      int_data = -int_data;
      float_data = -float_data;
    }

    if (is_int) {
      ret = int_data;
    } else {
      ret = float_data;
    }

  } else if (root_type_ch == '\"') {
    r.get_s8();

    string data;
    while (r.get_s8(false) != '\"') {
      char ch = r.get_s8();
      if (ch == '\\') {
        ch = r.get_s8();
        if (ch == '\"') {
          data.push_back('\"');
        } else if (ch == '\\') {
          data.push_back('\\');
        } else if (ch == '/') {
          data.push_back('/');
        } else if (ch == 'b') {
          data.push_back('\b');
        } else if (ch == 'f') {
          data.push_back('\f');
        } else if (ch == 'n') {
          data.push_back('\n');
        } else if (ch == 'r') {
          data.push_back('\r');
        } else if (ch == 't') {
          data.push_back('\t');
        } else if (ch == 'x') {
          uint8_t value;
          try {
            value = value_for_hex_char(r.get_s8()) << 4;
            value |= value_for_hex_char(r.get_s8());
          } catch (const out_of_range&) {
            throw parse_error("incomplete hex escape sequence in string; pos=" + to_string(r.where()));
          }
          data.push_back(value);
        } else if (ch == 'u') {
          uint16_t value;
          try {
            value = value_for_hex_char(r.get_s8()) << 12;
            value |= value_for_hex_char(r.get_s8()) << 8;
            value |= value_for_hex_char(r.get_s8()) << 4;
            value |= value_for_hex_char(r.get_s8());
          } catch (const out_of_range&) {
            throw parse_error("incomplete unicode escape sequence in string; pos=" + to_string(r.where()));
          }
          // TODO: we should eventually be able to support this
          if (value & 0xFF00) {
            throw parse_error("non-ascii unicode character sequence in string; pos=" + to_string(r.where()));
          }
          data.push_back(value);
        } else {
          throw parse_error("invalid escape sequence in string; pos=" + to_string(r.where()));
        }
      } else { // not an escape sequence
        data.push_back(ch);
      }
    }
    r.get_s8();

    ret = std::move(data);

  } else if (r.skip_if("null", 4) || (!disable_extensions && r.skip_if("n", 1))) {
    ret = nullptr;

  } else if (r.skip_if("true", 4) || (!disable_extensions && r.skip_if("t", 1))) {
    ret = true;

  } else if (r.skip_if("false", 5) || (!disable_extensions && r.skip_if("f", 1))) {
    ret = false;

  } else {
    throw parse_error("unknown root sentinel; pos=" + to_string(r.where()));
  }

  return ret;
}